

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::render_const_value
          (string *__return_storage_ptr__,t_dart_generator *this,ostream *out,string *name,
          t_type *type,t_const_value *value)

{
  uint uVar1;
  t_const_value_type tVar2;
  t_base_type *this_00;
  ostream *poVar3;
  int64_t iVar4;
  char *pcVar5;
  double dVar6;
  undefined1 auVar7 [12];
  string local_270;
  allocator local_249;
  string local_248;
  undefined1 local_228 [8];
  string t;
  string local_200;
  string local_1e0;
  t_base local_1c0;
  t_base tbase;
  undefined1 local_1b0 [8];
  ostringstream render;
  t_const_value *value_local;
  t_type *type_local;
  string *name_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  render._368_8_ = value;
  this_00 = (t_base_type *)t_generator::get_true_type(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,"tmp",&local_249);
      t_generator::tmp((string *)local_228,(t_generator *)this,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      std::__cxx11::string::string((string *)&local_270,(string *)local_228);
      print_const_value(this,out,&local_270,(t_type *)this_00,(t_const_value *)render._368_8_,true,
                        false);
      std::__cxx11::string::~string((string *)&local_270);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      std::operator<<((ostream *)local_1b0,(string *)local_228);
      std::__cxx11::string::~string((string *)local_228);
    }
    else {
      iVar4 = t_const_value::get_integer((t_const_value *)render._368_8_);
      std::ostream::operator<<(local_1b0,iVar4);
    }
  }
  else {
    local_1c0 = t_base_type::get_base(this_00);
    switch(local_1c0) {
    case TYPE_STRING:
      poVar3 = std::operator<<((ostream *)local_1b0,"\'");
      t_generator::get_escaped_string_abi_cxx11_
                (&local_1e0,(t_generator *)this,(t_const_value *)render._368_8_);
      poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
      std::operator<<(poVar3,"\'");
      std::__cxx11::string::~string((string *)&local_1e0);
      break;
    case TYPE_BOOL:
      iVar4 = t_const_value::get_integer((t_const_value *)render._368_8_);
      pcVar5 = "false";
      if (0 < iVar4) {
        pcVar5 = "true";
      }
      std::operator<<((ostream *)local_1b0,pcVar5);
      break;
    case TYPE_I8:
    case TYPE_I16:
    case TYPE_I32:
    case TYPE_I64:
      iVar4 = t_const_value::get_integer((t_const_value *)render._368_8_);
      std::ostream::operator<<(local_1b0,iVar4);
      break;
    case TYPE_DOUBLE:
      tVar2 = t_const_value::get_type((t_const_value *)render._368_8_);
      if (tVar2 == CV_INTEGER) {
        iVar4 = t_const_value::get_integer((t_const_value *)render._368_8_);
        std::ostream::operator<<(local_1b0,iVar4);
      }
      else {
        dVar6 = t_const_value::get_double((t_const_value *)render._368_8_);
        std::ostream::operator<<(local_1b0,dVar6);
      }
      break;
    default:
      t.field_2._M_local_buf[0xf] = '\x01';
      auVar7 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_200,(t_base_type *)(ulong)local_1c0,auVar7._8_4_);
      std::operator+(auVar7._0_8_,"compiler error: no const of base type ",&local_200);
      t.field_2._M_local_buf[0xf] = '\0';
      __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::render_const_value(ostream& out,
                                           string name,
                                           t_type* type,
                                           t_const_value* value) {
  (void)name;
  type = get_true_type(type);
  std::ostringstream render;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      render << "'" << get_escaped_string(value) << "'";
      break;
    case t_base_type::TYPE_BOOL:
      render << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      render << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        render << value->get_integer();
      } else {
        render << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    render << value->get_integer();
  } else {
    string t = tmp("tmp");
    print_const_value(out, t, type, value, true);
    out << endl;
    render << t;
  }

  return render.str();
}